

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfilesystemmodel.cpp
# Opt level: O3

void QFileSystemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorageHelper<QFileSystemModel::Option,_4> *pQVar1;
  code *pcVar2;
  long lVar3;
  undefined1 uVar4;
  QFlagsStorageHelper<QFileSystemModel::Option,_4> QVar5;
  int iVar6;
  long in_FS_OFFSET;
  void *local_38;
  void *local_30;
  void *pvStack_28;
  void *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      local_30 = _a[1];
      iVar6 = 2;
    }
    else if (_id == 1) {
      local_20 = _a[3];
      local_30 = _a[1];
      pvStack_28 = _a[2];
      iVar6 = 1;
    }
    else {
      if (_id != 0) break;
      local_30 = _a[1];
      iVar6 = 0;
    }
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_38);
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
      switch(_id) {
      case 0:
        uVar4 = QFileInfoGatherer::resolveSymlinks
                          (*(QFileInfoGatherer **)(*(long *)(_o + 8) + 0xe0));
        break;
      case 1:
        uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b1);
        break;
      case 2:
        uVar4 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b3);
        break;
      case 3:
        QVar5.super_QFlagsStorage<QFileSystemModel::Option>.i =
             (QFlagsStorage<QFileSystemModel::Option>)options((QFileSystemModel *)_o);
        pQVar1->super_QFlagsStorage<QFileSystemModel::Option> =
             QVar5.super_QFlagsStorage<QFileSystemModel::Option>.i;
        goto switchD_00616946_caseD_3;
      }
      *(undefined1 *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option> = uVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar1 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QFileInfoGatherer::setResolveSymlinks
                    (*(QFileInfoGatherer **)(*(long *)(_o + 8) + 0xe0),
                     *(bool *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
          return;
        }
        break;
      case 1:
        *(undefined1 *)(*(long *)(_o + 8) + 0x1b1) =
             *(undefined1 *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>;
        goto switchD_00616946_caseD_3;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setNameFilterDisables
                    ((QFileSystemModel *)_o,
                     *(bool *)&pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setOptions((QFileSystemModel *)_o,
                     (QFlagsStorageHelper<QFileSystemModel::Option,_4>)
                     pQVar1->super_QFlagsStorage<QFileSystemModel::Option>);
          return;
        }
      }
      goto LAB_00616b33;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == rootPathChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == fileRenamed && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == directoryLoaded && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
switchD_00616946_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_00616b33:
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileSystemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::rootPathChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & , const QString & , const QString & )>(_a, &QFileSystemModel::fileRenamed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::directoryLoaded, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resolveSymlinks(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->nameFilterDisables(); break;
        case 3: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResolveSymlinks(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNameFilterDisables(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}